

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O2

MPP_RET vpu_api_set_enc_cfg(MppCtx mpp_ctx,MppApi *mpi,MppEncCfg enc_cfg,MppCodingType coding,
                           MppFrameFormat fmt,EncParameter_t *cfg)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  MPP_RET MVar11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  undefined1 uVar15;
  MppFrameFormat MVar16;
  
  iVar12 = cfg->width;
  iVar1 = cfg->height;
  iVar2 = cfg->bitRate;
  iVar3 = cfg->framerate;
  iVar8 = cfg->framerateout;
  if (cfg->framerateout == 0) {
    iVar8 = iVar3;
  }
  iVar9 = cfg->intraPicRate;
  if (cfg->intraPicRate == 0) {
    iVar9 = iVar8;
  }
  if (coding - MPP_VIDEO_CodingAVC < 3) {
    iVar14 = *(int *)(&DAT_0010b718 + (ulong)(coding - MPP_VIDEO_CodingAVC) * 4);
  }
  else {
    iVar14 = 0x1a;
    if (coding != MPP_VIDEO_CodingHEVC) {
      iVar14 = 0;
    }
  }
  if (cfg->qp != 0) {
    iVar14 = cfg->qp;
  }
  iVar4 = cfg->rc_mode;
  RVar5 = cfg->profileIdc;
  RVar6 = cfg->levelIdc;
  RVar7 = cfg->enableCabac;
  _mpp_log_l(4,"vpu_api_legacy","setup encoder rate control config:\n",0);
  MVar16 = fmt;
  _mpp_log_l(4,"vpu_api_legacy","width %4d height %4d format %d:%x\n",0,iVar12,iVar1,cfg->format,fmt
            );
  pcVar13 = "CQP";
  if (iVar4 != 0) {
    pcVar13 = "CBR";
  }
  _mpp_log_l(4,"vpu_api_legacy","rc_mode %s qp %d bps %d\n",0,pcVar13,iVar14,iVar2,MVar16);
  _mpp_log_l(4,"vpu_api_legacy","fps in %d fps out %d gop %d\n",0,iVar3,iVar8,iVar9);
  _mpp_log_l(4,"vpu_api_legacy","setup encoder stream feature config:\n",0);
  _mpp_log_l(4,"vpu_api_legacy","profile %d level %d cabac %d\n",0,RVar5,RVar6,RVar7);
  if ((((iVar12 == 0) &&
       (_mpp_log_l(2,"vpu_api_legacy","Assertion %s failed at %s:%d\n",0,"width",
                   "vpu_api_set_enc_cfg",0x7a), (DAT_0011134b & 0x10) != 0)) ||
      ((iVar1 == 0 &&
       (_mpp_log_l(2,"vpu_api_legacy","Assertion %s failed at %s:%d\n",0,"height",
                   "vpu_api_set_enc_cfg",0x7b), (DAT_0011134b & 0x10) != 0)))) ||
     ((iVar14 == 0 &&
      (_mpp_log_l(2,"vpu_api_legacy","Assertion %s failed at %s:%d\n",0,"qp","vpu_api_set_enc_cfg",
                  0x7c), (DAT_0011134b & 0x10) != 0)))) {
    abort();
  }
  mpp_enc_cfg_set_s32(enc_cfg,"prep:width",iVar12);
  mpp_enc_cfg_set_s32(enc_cfg,"prep:height",iVar1);
  uVar10 = (fmt & 0xfffff) - MPP_FMT_RGB565;
  if (uVar10 < 0xe) {
    if ((0xfU >> (uVar10 & 0x1f) & 1) == 0) {
      if ((0x3c00U >> (uVar10 & 0x1f) & 1) == 0) {
        if ((0xc0U >> (uVar10 & 0x1f) & 1) == 0) goto LAB_00106531;
        uVar10 = (iVar12 + 0xfU & 0xfffffff0) * 3;
      }
      else {
        uVar10 = iVar12 * 4 + 0x3cU & 0xffffffc0;
      }
    }
    else {
      uVar10 = iVar12 * 2 + 0x1eU & 0xffffffe0;
    }
LAB_0010655d:
    mpp_enc_cfg_set_s32(enc_cfg,"prep:hor_stride",uVar10);
  }
  else {
LAB_00106531:
    if (((fmt & 0xfffff) < MPP_FMT_YUV422P) &&
       ((0x31U >> (fmt & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0)) {
      uVar10 = iVar12 + 0xfU & 0xfffffff0;
      goto LAB_0010655d;
    }
    _mpp_log_l(2,"vpu_api_legacy","unsupport format 0x%x\n",0);
  }
  mpp_enc_cfg_set_s32(enc_cfg,"prep:ver_stride",iVar1 + 7U & 0xfffffff8);
  mpp_enc_cfg_set_s32(enc_cfg,"prep:format",fmt);
  uVar15 = iVar4 != 0;
  iVar12 = iVar2 * 0xf;
  if (!(bool)uVar15) {
    iVar12 = iVar2;
  }
  if (iVar4 == 2) {
    uVar15 = 2;
  }
  mpp_enc_cfg_set_s32(enc_cfg,"rc:mode",uVar15);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:bps_target",iVar2);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:bps_max",(long)(iVar2 * 0x11) / 0x10 & 0xffffffff);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:bps_min",(long)iVar12 / 0x10 & 0xffffffff);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_in_flex",0);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_in_num",iVar3);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_in_denom",1);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_out_flex",0);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_out_num",iVar8);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:fps_out_denom",1);
  mpp_enc_cfg_set_s32(enc_cfg,"rc:gop",iVar9);
  mpp_enc_cfg_set_s32(enc_cfg,"codec:type",coding);
  if (coding == MPP_VIDEO_CodingVP8) {
    mpp_enc_cfg_set_s32(enc_cfg,"vp8:qp_init",0xffffffffffffffff);
    mpp_enc_cfg_set_s32(enc_cfg,"vp8:qp_min",0);
    mpp_enc_cfg_set_s32(enc_cfg,"vp8:qp_max",0x7f);
    mpp_enc_cfg_set_s32(enc_cfg,"vp8:qp_min_i",0);
    pcVar13 = "vp8:qp_max_i";
    iVar14 = 0x7f;
  }
  else if (coding == MPP_VIDEO_CodingMJPEG) {
    pcVar13 = "jpeg:quant";
  }
  else {
    if (coding != MPP_VIDEO_CodingAVC) {
      _mpp_log_l(2,"vpu_api_legacy","support encoder coding type %d\n","vpu_api_set_enc_cfg",coding)
      ;
      goto LAB_0010681a;
    }
    mpp_enc_cfg_set_s32(enc_cfg,"h264:profile",RVar5);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:level",RVar6);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:cabac_en",RVar7);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:cabac_idc",0);
    iVar12 = -1;
    if (iVar4 == 2) {
      iVar12 = iVar14;
    }
    iVar1 = iVar14;
    if (iVar4 != 2) {
      iVar14 = 0x33;
      iVar1 = 10;
    }
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_init",iVar12);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_min",iVar1);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_max",iVar14);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_min_i",10);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_max_i",0x33);
    mpp_enc_cfg_set_s32(enc_cfg,"h264:qp_step",4);
    pcVar13 = "h264:qp_delta_ip";
    iVar14 = 3;
  }
  mpp_enc_cfg_set_s32(enc_cfg,pcVar13,iVar14);
LAB_0010681a:
  MVar11 = (*mpi->control)(mpp_ctx,MPP_ENC_SET_CFG,enc_cfg);
  if (MVar11 != MPP_OK) {
    _mpp_log_l(2,"vpu_api_legacy","setup enc config failed ret %d\n",0,MVar11);
  }
  return MVar11;
}

Assistant:

static MPP_RET vpu_api_set_enc_cfg(MppCtx mpp_ctx, MppApi *mpi, MppEncCfg enc_cfg,
                                   MppCodingType coding, MppFrameFormat fmt,
                                   EncParameter_t *cfg)
{
    MPP_RET ret = MPP_OK;
    RK_S32 width    = cfg->width;
    RK_S32 height   = cfg->height;
    RK_S32 bps      = cfg->bitRate;
    RK_S32 fps_in   = cfg->framerate;
    RK_S32 fps_out  = (cfg->framerateout) ? (cfg->framerateout) : (fps_in);
    RK_S32 gop      = (cfg->intraPicRate) ? (cfg->intraPicRate) : (fps_out);
    RK_S32 qp_init  = (coding == MPP_VIDEO_CodingAVC) ? (26) :
                      (coding == MPP_VIDEO_CodingMJPEG) ? (10) :
                      (coding == MPP_VIDEO_CodingVP8) ? (56) :
                      (coding == MPP_VIDEO_CodingHEVC) ? (26) : (0);
    RK_S32 qp       = (cfg->qp) ? (cfg->qp) : (qp_init);
    RK_S32 profile  = cfg->profileIdc;
    RK_S32 level    = cfg->levelIdc;
    RK_S32 cabac_en = cfg->enableCabac;
    RK_S32 rc_mode  = cfg->rc_mode;
    RK_U32 is_fix_qp = (rc_mode == MPP_ENC_RC_MODE_FIXQP) ? 1 : 0;

    mpp_log("setup encoder rate control config:\n");
    mpp_log("width %4d height %4d format %d:%x\n", width, height, cfg->format, fmt);
    mpp_log("rc_mode %s qp %d bps %d\n", (rc_mode) ? ("CBR") : ("CQP"), qp, bps);
    mpp_log("fps in %d fps out %d gop %d\n", fps_in, fps_out, gop);
    mpp_log("setup encoder stream feature config:\n");
    mpp_log("profile %d level %d cabac %d\n", profile, level, cabac_en);

    mpp_assert(width);
    mpp_assert(height);
    mpp_assert(qp);

    mpp_enc_cfg_set_s32(enc_cfg, "prep:width", width);
    mpp_enc_cfg_set_s32(enc_cfg, "prep:height", height);
    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420P:
    case MPP_FMT_YUV420SP :
    case MPP_FMT_YUV420SP_VU : {
        mpp_enc_cfg_set_s32(enc_cfg, "prep:hor_stride", MPP_ALIGN(width, 16));
    } break;
    case MPP_FMT_RGB565:
    case MPP_FMT_BGR565:
    case MPP_FMT_RGB555:
    case MPP_FMT_BGR555: {
        mpp_enc_cfg_set_s32(enc_cfg, "prep:hor_stride", 2 * MPP_ALIGN(width, 16));
    } break;
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 : {
        mpp_enc_cfg_set_s32(enc_cfg, "prep:hor_stride", 3 * MPP_ALIGN(width, 16));
    } break;
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        mpp_enc_cfg_set_s32(enc_cfg, "prep:hor_stride", 4 * MPP_ALIGN(width, 16));
    } break;
    default: {
        mpp_err("unsupport format 0x%x\n", fmt & MPP_FRAME_FMT_MASK);
    } break;
    }
    mpp_enc_cfg_set_s32(enc_cfg, "prep:ver_stride", MPP_ALIGN(height, 8));
    mpp_enc_cfg_set_s32(enc_cfg, "prep:format", fmt);

    mpp_enc_cfg_set_s32(enc_cfg, "rc:mode", is_fix_qp ? MPP_ENC_RC_MODE_FIXQP :
                        (rc_mode ? MPP_ENC_RC_MODE_CBR : MPP_ENC_RC_MODE_VBR));
    mpp_enc_cfg_set_s32(enc_cfg, "rc:bps_target", bps);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:bps_max", bps * 17 / 16);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:bps_min", rc_mode ? bps * 15 / 16 : bps * 1 / 16);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_in_flex", 0);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_in_num", fps_in);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_in_denom", 1);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_out_flex", 0);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_out_num", fps_out);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:fps_out_denom", 1);
    mpp_enc_cfg_set_s32(enc_cfg, "rc:gop", gop);

    mpp_enc_cfg_set_s32(enc_cfg, "codec:type", coding);
    switch (coding) {
    case MPP_VIDEO_CodingAVC : {
        mpp_enc_cfg_set_s32(enc_cfg, "h264:profile", profile);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:level", level);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:cabac_en", cabac_en);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:cabac_idc", 0);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_init", is_fix_qp ? qp : -1);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_min", is_fix_qp  ? qp : 10);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_max", is_fix_qp ? qp : 51);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_min_i", 10);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_max_i", 51);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_step", 4);
        mpp_enc_cfg_set_s32(enc_cfg, "h264:qp_delta_ip", 3);
    } break;
    case MPP_VIDEO_CodingVP8 : {
        mpp_enc_cfg_set_s32(enc_cfg, "vp8:qp_init", -1);
        mpp_enc_cfg_set_s32(enc_cfg, "vp8:qp_min", 0);
        mpp_enc_cfg_set_s32(enc_cfg, "vp8:qp_max", 127);
        mpp_enc_cfg_set_s32(enc_cfg, "vp8:qp_min_i", 0);
        mpp_enc_cfg_set_s32(enc_cfg, "vp8:qp_max_i", 127);
    } break;
    case MPP_VIDEO_CodingMJPEG : {
        mpp_enc_cfg_set_s32(enc_cfg, "jpeg:quant", qp);
    } break;
    default : {
        mpp_err_f("support encoder coding type %d\n", coding);
    } break;
    }

    ret = mpi->control(mpp_ctx, MPP_ENC_SET_CFG, enc_cfg);
    if (ret) {
        mpp_err("setup enc config failed ret %d\n", ret);
        goto RET;
    }
RET:
    return ret;
}